

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  ReflectionSchema *this_00;
  byte bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  LogMessage *pLVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  LogFinisher local_a5;
  uint32_t local_a4;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (lhs != rhs) {
    uVar10 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar3 = *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar10);
    *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar10) =
         *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar10);
    *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar10) = uVar3;
    if (-1 < this->last_non_weak_field_index_) {
      lVar13 = -1;
      lVar14 = 0;
      do {
        lVar11 = *(long *)(this->descriptor_ + 0x28);
        if ((((*(byte *)(lVar11 + 1 + lVar14) & 0x10) == 0) ||
            (lVar4 = *(long *)(lVar11 + 0x28 + lVar14), lVar4 == 0)) ||
           ((*(int *)(lVar4 + 4) == 1 && ((*(byte *)(*(long *)(lVar4 + 0x20) + 1) & 2) != 0)))) {
          UnsafeShallowSwapField(this,lhs,rhs,(FieldDescriptor *)(lVar11 + lVar14));
        }
        lVar13 = lVar13 + 1;
        lVar14 = lVar14 + 0x48;
      } while (lVar13 < this->last_non_weak_field_index_);
    }
    iVar8 = *(int *)(this->descriptor_ + 0x68);
    if (0 < (long)iVar8) {
      lVar13 = 0;
      do {
        lVar14 = *(long *)(this->descriptor_ + 0x30);
        if ((*(int *)(lVar14 + 4 + lVar13) != 1) ||
           ((*(byte *)(*(long *)(lVar14 + 0x20 + lVar13) + 1) & 2) == 0)) {
          SwapOneofField<true>(this,lhs,rhs,(OneofDescriptor *)(lVar14 + lVar13));
        }
        lVar13 = lVar13 + 0x28;
      } while ((long)iVar8 * 0x28 != lVar13);
    }
    this_00 = &this->schema_;
    if ((this->schema_).has_bits_offset_ != -1) {
      if ((this->schema_).has_bits_offset_ == -1) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x975);
        pLVar7 = internal::LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar7);
        internal::LogMessage::~LogMessage(&local_68);
      }
      uVar5 = internal::ReflectionSchema::HasBitsOffset(this_00);
      if ((this->schema_).has_bits_offset_ == -1) {
        local_a4 = uVar5;
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x975);
        pLVar7 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: schema_.HasHasbits(): ");
        internal::LogFinisher::operator=(&local_a5,pLVar7);
        internal::LogMessage::~LogMessage(&local_a0);
        uVar5 = local_a4;
      }
      uVar6 = internal::ReflectionSchema::HasBitsOffset(this_00);
      lVar13 = (long)*(int *)(this->descriptor_ + 4);
      if (lVar13 < 1) {
        iVar8 = 0;
      }
      else {
        lVar14 = *(long *)(this->descriptor_ + 0x28);
        lVar11 = 0;
        iVar8 = 0;
        do {
          bVar1 = *(byte *)(lVar14 + 1 + lVar11);
          if ((~bVar1 & 0x60) != 0) {
            uVar12 = 1;
            if ((((bVar1 & 0x10) != 0) && (lVar4 = *(long *)(lVar14 + 0x28 + lVar11), lVar4 != 0))
               && (uVar12 = 0, *(int *)(lVar4 + 4) == 1)) {
              uVar12 = *(byte *)(*(long *)(lVar4 + 0x20) + 1) >> 1 & 1;
            }
            iVar8 = iVar8 + uVar12;
          }
          lVar11 = lVar11 + 0x48;
        } while (lVar13 * 0x48 != lVar11);
      }
      if (0 < iVar8) {
        uVar12 = iVar8 + 0x1fU >> 5;
        uVar10 = 1;
        if (1 < uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar9 = 0;
        do {
          uVar2 = *(undefined4 *)
                   ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar9 * 4 + (ulong)uVar5);
          *(undefined4 *)
           ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar9 * 4 + (ulong)uVar5) =
               *(undefined4 *)
                ((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar9 * 4 + (ulong)uVar6);
          *(undefined4 *)
           ((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar9 * 4 + (ulong)uVar6) = uVar2;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      internal::ExtensionSet::InternalSwap
                ((ExtensionSet *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                 (ExtensionSet *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6))
      ;
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsFieldStripped(field)) continue;
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField<true>(lhs, rhs, oneof);
    }
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32* lhs_has_bits = MutableHasBits(lhs);
    uint32* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}